

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Glucose::SimpSolver::substitute(SimpSolver *this,Var v,Lit x)

{
  Lit p_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  vec<unsigned_int> *this_00;
  Clause *this_01;
  Lit *pLVar4;
  ulong uVar5;
  uchar *tbs;
  Lit in_EDX;
  size_t *siglen;
  int in_ESI;
  uchar *sig;
  long *in_RDI;
  size_t in_R8;
  Lit p;
  int j;
  Clause *c;
  int i;
  vec<Glucose::Lit> *subst_clause;
  vec<unsigned_int> *cls;
  Lit *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_3c;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  int index;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x27) & 1) == 0) {
    local_1 = false;
  }
  else {
    pcVar3 = vec<char>::operator[]((vec<char> *)(in_RDI + 0xb2),in_ESI);
    *pcVar3 = '\x01';
    Solver::setDecisionVar
              ((Solver *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (Var)((ulong)in_stack_ffffffffffffff98 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff98 >> 0x18,0));
    this_00 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::lookup
                        ((OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>
                          *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
    iVar6 = 0;
    while (index = iVar6, iVar1 = vec<unsigned_int>::size(this_00), iVar6 < iVar1) {
      vec<unsigned_int>::operator[](this_00,index);
      this_01 = ClauseAllocator::operator[]
                          ((ClauseAllocator *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (Ref)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      vec<Glucose::Lit>::clear
                ((vec<Glucose::Lit> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
      local_3c = 0;
      while( true ) {
        in_stack_ffffffffffffff94 = local_3c;
        uVar2 = Clause::size(this_01);
        tbs = (uchar *)(ulong)uVar2;
        if ((int)uVar2 <= (int)in_stack_ffffffffffffff94) break;
        sig = (uchar *)(ulong)local_3c;
        pLVar4 = Clause::operator[](this_01,local_3c);
        p_00.x = pLVar4->x;
        in_stack_ffffffffffffff88 = (Lit *)(in_RDI + 0x84);
        iVar6 = var(p_00);
        if (iVar6 == in_ESI) {
          iVar6 = sign((EVP_PKEY_CTX *)(ulong)(uint)p_00.x,sig,siglen,tbs,in_R8);
          operator^(in_EDX,(bool)((byte)iVar6 & 1));
        }
        vec<Glucose::Lit>::push
                  ((vec<Glucose::Lit> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
        local_3c = local_3c + 1;
      }
      uVar5 = (**(code **)(*in_RDI + 0x20))(in_RDI,(Lit *)(in_RDI + 0x84));
      if ((uVar5 & 1) == 0) {
        *(undefined1 *)(in_RDI + 0x27) = 0;
        return false;
      }
      vec<unsigned_int>::operator[](this_00,index);
      removeClause((SimpSolver *)CONCAT44(index,in_stack_ffffffffffffffd0),
                   (CRef)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0));
      iVar6 = index + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SimpSolver::substitute(Var v, Lit x)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    if (!ok) return false;

    eliminated[v] = true;
    setDecisionVar(v, false);
    const vec<CRef>& cls = occurs.lookup(v);
    
    vec<Lit>& subst_clause = add_tmp;
    for (int i = 0; i < cls.size(); i++){
        Clause& c = ca[cls[i]];

        subst_clause.clear();
        for (int j = 0; j < c.size(); j++){
            Lit p = c[j];
            subst_clause.push(var(p) == v ? x ^ sign(p) : p);
        }

 
        if (!addClause_(subst_clause))
            return ok = false;

       removeClause(cls[i]);
 
   }

    return true;
}